

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O0

void Test_TemplateModifiers_FindModifier::Run(void)

{
  byte bVar1;
  long lVar2;
  NullModifier local_48 [8];
  NullModifier foo_modifier5;
  NullModifier local_30 [8];
  NullModifier foo_modifier4;
  NullModifier foo_modifier3;
  NullModifier foo_modifier2;
  NullModifier foo_modifier1;
  ModifierInfo *info;
  
  lVar2 = ctemplate::FindModifier("html_escape",0xb,"",0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"html_escape\", 11, \"\", 0))");
    exit(1);
  }
  if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&ctemplate::html_escape");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("h",1,"",0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"h\", 1, \"\", 0))");
    exit(1);
  }
  if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::html_escape) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&ctemplate::html_escape");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"=pre",4);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"html_escape_with_arg\", 20, \"=pre\", 4))");
    exit(1);
  }
  if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&ctemplate::pre_escape");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("H",1,"=pre",4);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"H\", 1, \"=pre\", 4))");
    exit(1);
  }
  if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::pre_escape) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&ctemplate::pre_escape");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("javascript_escape_with_arg",0x1a,"=number",7);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"javascript_escape_with_arg\", 26, \"=number\", 7))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("J",1,"=number",7);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"J\", 1, \"=number\", 7))");
    exit(1);
  }
  if (*(undefined8 **)(lVar2 + 0x28) != &ctemplate::javascript_number) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&ctemplate::javascript_number"
           );
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("H",1,"=pre",2);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::FindModifier(\"H\", 1, \"=pre\", 2))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("H",1,"=pree",5);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::FindModifier(\"H\", 1, \"=pree\", 5))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("H",1,"=notpresent",0xb);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::FindModifier(\"H\", 1, \"=notpresent\", 11))"
           );
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("html_escape",0xb,"=p",2);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::FindModifier(\"html_escape\", 11, \"=p\", 2))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("h",1,"=p",2);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::FindModifier(\"h\", 1, \"=p\", 2))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("html_escape_with_arg",0x14,"",0);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "!(ctemplate::FindModifier(\"html_escape_with_arg\", 20, \"\", 0))");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("H",1,"",0);
  if (lVar2 != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(ctemplate::FindModifier(\"H\", 1, \"\", 0))");
    exit(1);
  }
  ctemplate::NullModifier::NullModifier(&foo_modifier2);
  ctemplate::NullModifier::NullModifier(&foo_modifier3);
  ctemplate::NullModifier::NullModifier(&foo_modifier4);
  ctemplate::NullModifier::NullModifier(local_30);
  bVar1 = ctemplate::AddModifier("x-test",(TemplateModifier *)&foo_modifier2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-test\", &foo_modifier1)");
    exit(1);
  }
  bVar1 = ctemplate::AddModifier("x-test-arg=",(TemplateModifier *)&foo_modifier3);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-test-arg=\", &foo_modifier2)");
    exit(1);
  }
  bVar1 = ctemplate::AddModifier("x-test-arg=h",(TemplateModifier *)&foo_modifier4);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","ctemplate::AddModifier(\"x-test-arg=h\", &foo_modifier3)")
    ;
    exit(1);
  }
  bVar1 = ctemplate::AddModifier("x-test-arg=json",(TemplateModifier *)local_30);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddModifier(\"x-test-arg=json\", &foo_modifier4)");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test",6,"",0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-test\", 6, \"\", 0))")
    ;
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier1");
    exit(1);
  }
  if (*(int *)(lVar2 + 0x24) != 2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->xss_class","==","ctemplate::XSS_UNIQUE");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test",6,"=h",2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test\", 6, \"=h\", 2))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(info->is_registered)");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=p",2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=p\", 2))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier2");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=h",2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=h\", 2))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier4) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier3");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=html",5);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=html\", 5))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier2");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=json",5);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=json\", 5))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != local_30) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier4");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"json",4);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"json\", 4))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier2");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",5);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 5))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != local_30) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier4");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",6);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 6))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier2");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-test-arg",10,"=jsonnabbe",4);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-test-arg\", 10, \"=jsonnabbe\", 4))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != &foo_modifier3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier2");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-foo",5,"",0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-foo\", 5, \"\", 0))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(info->is_registered)");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-bar",5,"=p",2);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n","(info = ctemplate::FindModifier(\"x-bar\", 5, \"=p\", 2))"
           );
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) != 0) {
    fprintf(_stderr,"Check failed: %s\n","!(info->is_registered)");
    exit(1);
  }
  ctemplate::NullModifier::NullModifier(local_48);
  bVar1 = ctemplate::AddXssSafeModifier("x-safetest",(TemplateModifier *)local_48);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "ctemplate::AddXssSafeModifier(\"x-safetest\", &foo_modifier5)");
    exit(1);
  }
  lVar2 = ctemplate::FindModifier("x-safetest",10,"",0);
  if (lVar2 == 0) {
    fprintf(_stderr,"Check failed: %s\n",
            "(info = ctemplate::FindModifier(\"x-safetest\", 10, \"\", 0))");
    exit(1);
  }
  if ((*(byte *)(lVar2 + 0x22) & 1) == 0) {
    fprintf(_stderr,"Check failed: %s\n","info->is_registered");
    exit(1);
  }
  if (*(int *)(lVar2 + 0x24) != 3) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->xss_class","==","ctemplate::XSS_SAFE");
    exit(1);
  }
  if (*(NullModifier **)(lVar2 + 0x28) != local_48) {
    fprintf(_stderr,"Check failed: %s %s %s\n","info->modifier","==","&foo_modifier5");
    exit(1);
  }
  ctemplate::NullModifier::~NullModifier(local_48);
  ctemplate::NullModifier::~NullModifier(local_30);
  ctemplate::NullModifier::~NullModifier(&foo_modifier4);
  ctemplate::NullModifier::~NullModifier(&foo_modifier3);
  ctemplate::NullModifier::~NullModifier(&foo_modifier2);
  return;
}

Assistant:

TEST(TemplateModifiers, FindModifier) {
  const GOOGLE_NAMESPACE::ModifierInfo* info;
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("h", 1, "", 0)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::html_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                              "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 4)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::pre_escape);

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("javascript_escape_with_arg",
                                              26, "=number", 7)));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("J", 1, "=number", 7)));
  EXPECT_EQ(info->modifier, &GOOGLE_NAMESPACE::javascript_number);

  // html_escape_with_arg doesn't have a default value, so these should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pre", 2));  // "=p"
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=pree", 5));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "=notpresent", 11));

  // If we don't have a modifier-value when we ought, we should fail.
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape", 11, "=p", 2));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("h", 1, "=p", 2));

  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("html_escape_with_arg", 20,
                                       "", 0));
  EXPECT_FALSE(GOOGLE_NAMESPACE::FindModifier("H", 1, "", 0));

  // Test with added modifiers as well.
  GOOGLE_NAMESPACE::NullModifier foo_modifier1;
  GOOGLE_NAMESPACE::NullModifier foo_modifier2;
  GOOGLE_NAMESPACE::NullModifier foo_modifier3;
  GOOGLE_NAMESPACE::NullModifier foo_modifier4;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test", &foo_modifier1));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=", &foo_modifier2));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=h", &foo_modifier3));
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddModifier("x-test-arg=json", &foo_modifier4));

  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier1);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_UNIQUE);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test", 6, "=h", 2)));
  EXPECT_FALSE(info->is_registered);
  // This tests default values
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=p", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=h", 2)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier3);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=html", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "=json", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  // The value is required to start with an '=' to match the
  // specialization.  If it doesn't, it will match the default.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10, "json", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 5)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier4);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 6)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-test-arg", 10,
                                              "=jsonnabbe", 4)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->modifier, &foo_modifier2);

  // If we try to find an x- modifier that wasn't added, we should get
  // a legit but "unknown" modifier back.
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-foo", 5, "", 0)));
  EXPECT_FALSE(info->is_registered);
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-bar", 5, "=p", 2)));
  EXPECT_FALSE(info->is_registered);

  // Basic test with added XssSafe modifier.
  GOOGLE_NAMESPACE::NullModifier foo_modifier5;
  EXPECT_TRUE(GOOGLE_NAMESPACE::AddXssSafeModifier("x-safetest",
                                            &foo_modifier5));
  EXPECT_TRUE((info = GOOGLE_NAMESPACE::FindModifier("x-safetest", 10, "", 0)));
  EXPECT_TRUE(info->is_registered);
  EXPECT_EQ(info->xss_class, GOOGLE_NAMESPACE::XSS_SAFE);
  EXPECT_EQ(info->modifier, &foo_modifier5);
}